

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

longdouble * strtold_s(longdouble *__return_storage_ptr__,char *nptr,char **endptr)

{
  FLOAT_STRING_TYPE FVar1;
  char **extraout_RAX;
  longdouble result;
  char *runner;
  double dStack_28;
  int exponential;
  double fraction;
  char **ppcStack_18;
  int signal;
  char **endptr_local;
  char *nptr_local;
  
  fraction._4_4_ = 1;
  unique0x1000010b = (char **)__return_storage_ptr__;
  ppcStack_18 = (char **)nptr;
  if (__return_storage_ptr__ != (longdouble *)0x0) {
    endptr_local = (char **)__return_storage_ptr__;
    FVar1 = splitFloatString((char *)__return_storage_ptr__,(char **)((long)&result + 8),
                             (int *)((long)&fraction + 4),&stack0xffffffffffffffd8,
                             (int *)((long)&runner + 4));
    if (FVar1 - FST_INFINITY < 4) {
      __return_storage_ptr__ =
           (longdouble *)
           ((long)&switchD_0014c80b::switchdataD_0015e298 +
           (long)(int)(&switchD_0014c80b::switchdataD_0015e298)[FVar1 - FST_INFINITY]);
      switch(FVar1) {
      case FST_INFINITY:
        __return_storage_ptr__ = (longdouble *)__errno_location();
        *(int *)__return_storage_ptr__ = 0;
        break;
      case FST_NAN:
        break;
      case FST_NUMBER:
        if (((runner._4_4_ == 0x134) && (1.7976931348623157 < dStack_28)) ||
           ((runner._4_4_ == -0x134 && (2.2250738585072014 < dStack_28)))) {
          __return_storage_ptr__ = (longdouble *)__errno_location();
          *(int *)__return_storage_ptr__ = 0x22;
        }
        else {
          pow(10.0,(double)runner._4_4_);
          __return_storage_ptr__ = (longdouble *)extraout_RAX;
        }
        break;
      case FST_OVERFLOW:
        __return_storage_ptr__ = (longdouble *)__errno_location();
        *(int *)__return_storage_ptr__ = 0x22;
      }
    }
    else {
      stack0xffffffffffffffc8 = endptr_local;
      __return_storage_ptr__ = (longdouble *)endptr_local;
    }
  }
  if (ppcStack_18 != (char **)0x0) {
    *ppcStack_18 = (char *)stack0xffffffffffffffc8;
    __return_storage_ptr__ = (longdouble *)ppcStack_18;
  }
  return __return_storage_ptr__;
}

Assistant:

long double strtold_s(const char* nptr, char** endptr)
{
    int signal = 1;
    double fraction;
    int exponential;
    char* runner = (char*)nptr;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_031: [If no conversion could be performed, the strtold_s returns the value 0.0.]*/
    long double result = 0.0;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_037: [If the nptr is NULL, the strtold_s must not perform any conversion and must returns 0.0; endptr must receive NULL, provided that endptr is not a NULL pointer.]*/
    if (nptr != NULL)
    {
        switch (splitFloatString(nptr, &runner, &signal, &fraction, &exponential))
        {
        case FST_INFINITY:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_033: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtold_s must return the INFINITY value for long double.]*/
            result = (long double)INFINITY * (long double)(signal);
            errno = 0;
            break;
        case FST_NAN:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_034: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtold_s must return 0.0 and points endptr to the first character after the 'NAN' sequence.]*/
#ifdef _MSC_VER
#pragma warning(disable:26451) // warning C26451: overflow in constant arithmetic
#endif
            result = (long double)NAN;
#ifdef _MSC_VER
#pragma warning (default:26451)
#endif
            break;
        case FST_NUMBER:
            if ((exponential != DBL_MAX_10_EXP || (fraction <= 1.7976931348623158)) &&
                (exponential != (DBL_MAX_10_EXP * (-1)) || (fraction <= 2.2250738585072014)))
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_026: [The strtold_s must return the long double that represents the value in the initial part of the string. If any.]*/
                result = fraction * pow(10.0, (double)exponential) * (double)signal;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_032: [If the correct value is outside the range, the strtold_s returns the value plus or minus HUGE_VALL, and errno will receive the value ERANGE.]*/
                result = (long double)HUGE_VALF * (long double)(signal);
                errno = ERANGE;
            }
            break;
        case FST_OVERFLOW:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_032: [If the correct value is outside the range, the strtold_s returns the value plus or minus HUGE_VALL, and errno will receive the value ERANGE.]*/
            result = (long double)HUGE_VALF * (long double)(signal);
            errno = ERANGE;
            break;
        default:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_030: [If the subject sequence is empty or does not have the expected form, the strtold_s must not perform any conversion and must returns 0.0; the value of nptr is stored in the object pointed to by endptr, provided that endptr is not a NULL pointer.]*/
            runner = (char*)nptr;
            break;
        }
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_027: [The strtold_s must return in endptr a final string of one or more unrecognized characters, including the terminating null character of the input string.]*/
    if (endptr != NULL)
    {
        (*endptr) = runner;
    }

    return result;
}